

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

int32_t decCompare(decNumber *lhs,decNumber *rhs,uint8_t abs_c)

{
  uint local_58;
  uint local_44;
  decNumber *temp;
  int32_t compare;
  int32_t sigr;
  int32_t result;
  uint8_t abs_c_local;
  decNumber *rhs_local;
  decNumber *lhs_local;
  
  compare = 1;
  if (((lhs->lsu[0] == '\0') && (lhs->digits == 1)) && ((lhs->bits & 0x70) == 0)) {
    compare = 0;
  }
  if (abs_c == '\0') {
    if ((compare != 0) && ((lhs->bits & 0x80) != 0)) {
      compare = -1;
    }
    temp._4_4_ = 1;
    if (((rhs->lsu[0] == '\0') && (rhs->digits == 1)) && ((rhs->bits & 0x70) == 0)) {
      temp._4_4_ = 0;
    }
    else if ((rhs->bits & 0x80) != 0) {
      temp._4_4_ = -1;
    }
    if (temp._4_4_ < compare) {
      return 1;
    }
    if (compare < temp._4_4_) {
      return -1;
    }
    if (compare == 0) {
      return 0;
    }
  }
  else {
    if (((rhs->lsu[0] == '\0') && (rhs->digits == 1)) && ((rhs->bits & 0x70) == 0)) {
      return compare;
    }
    if (compare == 0) {
      return -1;
    }
  }
  if (((lhs->bits | rhs->bits) & 0x40) == 0) {
    _result = rhs;
    rhs_local = lhs;
    if (rhs->exponent < lhs->exponent) {
      compare = -compare;
      _result = lhs;
      rhs_local = rhs;
    }
    if (rhs_local->digits < 0x32) {
      local_44 = (uint)""[rhs_local->digits];
    }
    else {
      local_44 = rhs_local->digits / 1;
    }
    if (_result->digits < 0x32) {
      local_58 = (uint)""[_result->digits];
    }
    else {
      local_58 = _result->digits / 1;
    }
    temp._0_4_ = decUnitCompare(rhs_local->lsu,local_44,_result->lsu,local_58,
                                _result->exponent - rhs_local->exponent);
    if ((int32_t)temp != -0x80000000) {
      temp._0_4_ = compare * (int32_t)temp;
    }
    lhs_local._4_4_ = (int32_t)temp;
  }
  else {
    if ((rhs->bits & 0x40) != 0) {
      if ((lhs->bits & 0x40) == 0) {
        compare = -compare;
      }
      else {
        compare = 0;
      }
    }
    lhs_local._4_4_ = compare;
  }
  return lhs_local._4_4_;
}

Assistant:

static Int decCompare(const decNumber *lhs, const decNumber *rhs,
                      Flag abs_c) {
  Int   result;                    /* result value  */
  Int   sigr;                      /* rhs signum  */
  Int   compare;                   /* work  */

  result=1;                                  /* assume signum(lhs)  */
  if (ISZERO(lhs)) result=0;
  if (abs_c) {
    if (ISZERO(rhs)) return result;          /* LHS wins or both 0  */
    /* RHS is non-zero  */
    if (result==0) return -1;                /* LHS is 0; RHS wins  */
    /* [here, both non-zero, result=1]  */
    }
   else {                                    /* signs matter  */
    if (result && decNumberIsNegative(lhs)) result=-1;
    sigr=1;                                  /* compute signum(rhs)  */
    if (ISZERO(rhs)) sigr=0;
     else if (decNumberIsNegative(rhs)) sigr=-1;
    if (result > sigr) return +1;            /* L > R, return 1  */
    if (result < sigr) return -1;            /* L < R, return -1  */
    if (result==0) return 0;                   /* both 0  */
    }

  /* signums are the same; both are non-zero  */
  if ((lhs->bits | rhs->bits) & DECINF) {    /* one or more infinities  */
    if (decNumberIsInfinite(rhs)) {
      if (decNumberIsInfinite(lhs)) result=0;/* both infinite  */
       else result=-result;                  /* only rhs infinite  */
      }
    return result;
    }
  /* must compare the coefficients, allowing for exponents  */
  if (lhs->exponent>rhs->exponent) {         /* LHS exponent larger  */
    /* swap sides, and sign  */
    const decNumber *temp=lhs;
    lhs=rhs;
    rhs=temp;
    result=-result;
    }
  compare=decUnitCompare(lhs->lsu, D2U(lhs->digits),
                         rhs->lsu, D2U(rhs->digits),
                         rhs->exponent-lhs->exponent);
  if (compare!=BADINT) compare*=result;      /* comparison succeeded  */
  return compare;
  }